

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

bool copy_accessed_types(DatabaseInterface *input_db,DatabaseInterface *output_db,
                        vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *accessed,ResourceTag tag,uint *per_tag_written)

{
  size_type sVar1;
  pointer puVar2;
  int iVar3;
  const_iterator __begin1;
  size_t compressed_size;
  size_type local_40;
  DatabaseInterface *local_38;
  
  *(ResourceTag *)(compressed_size + ((ulong)per_tag_written & 0xffffffff) * 4) = tag;
  local_38 = output_db;
  if (accessed !=
      (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       *)0x0) {
    do {
      sVar1 = (accessed->_M_h)._M_bucket_count;
      local_40 = 0;
      iVar3 = (*input_db->_vptr_DatabaseInterface[3])
                        (input_db,(ulong)per_tag_written & 0xffffffff,sVar1,&local_40,0,1);
      if ((char)iVar3 == '\0') {
        if ((int)per_tag_written != 4) {
          return false;
        }
        fprintf(_stderr,
                "Fossilize ERROR: Reference shader module %016lx does not exist in database.\n",
                sVar1);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(state_json,local_40);
        iVar3 = (*input_db->_vptr_DatabaseInterface[3])
                          (input_db,(ulong)per_tag_written & 0xffffffff,sVar1,&local_40,
                           (state_json->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start,1);
        if ((char)iVar3 == '\0') {
          return false;
        }
        puVar2 = (state_json->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar3 = (*local_38->_vptr_DatabaseInterface[4])
                          (local_38,(ulong)per_tag_written & 0xffffffff,sVar1,puVar2,
                           (long)(state_json->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2,1);
        if ((char)iVar3 == '\0') {
          return false;
        }
      }
      accessed = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)(accessed->_M_h)._M_buckets;
    } while (accessed !=
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x0);
  }
  return true;
}

Assistant:

static bool copy_accessed_types(DatabaseInterface &input_db,
                                DatabaseInterface &output_db,
                                vector<uint8_t> &state_json,
                                const unordered_set<Hash> &accessed,
                                ResourceTag tag,
                                unsigned *per_tag_written)
{
	per_tag_written[tag] = accessed.size();
	for (auto hash : accessed)
	{
		size_t compressed_size = 0;
		if (!input_db.read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
		{
			if (tag == RESOURCE_SHADER_MODULE)
			{
				// We did not resolve shader module references, so we might hit an error here, but that's fine.
				LOGE("Reference shader module %016" PRIx64 " does not exist in database.\n", hash);
				continue;
			}
			else
				return false;
		}

		state_json.resize(compressed_size);

		if (!input_db.read_entry(tag, hash, &compressed_size, state_json.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			return false;
		if (!output_db.write_entry(tag, hash, state_json.data(), state_json.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
			return false;
	}
	return true;
}